

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# goeslrit.cc
# Opt level: O1

int main(int argc,char **argv)

{
  long *plVar1;
  SessionPDU *pSVar2;
  pointer puVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  _Rb_tree_header *p_Var7;
  undefined8 *puVar8;
  ostream *poVar9;
  int *piVar10;
  size_t sVar11;
  _Base_ptr p_Var12;
  _Rb_tree_header *p_Var13;
  _Base_ptr p_Var14;
  long lVar15;
  pointer spdu;
  char *pcVar16;
  ulong uVar17;
  undefined8 uVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  spdus;
  Options opts;
  Assembler assembler;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  array<unsigned_char,_892UL> buf;
  FileReader *local_6e8;
  long *local_6e0;
  long local_6d8;
  long local_6d0;
  undefined8 uStack_6c8;
  string local_6c0;
  undefined8 local_6a0;
  ulong *local_698;
  vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  local_690;
  Options local_678;
  _Rb_tree<int,_std::pair<const_int,_assembler::VirtualChannel>,_std::_Select1st<std::pair<const_int,_assembler::VirtualChannel>_>,_std::less<int>,_std::allocator<std::pair<const_int,_assembler::VirtualChannel>_>_>
  local_5e0;
  ulong *local_5b0;
  long local_5a8;
  ulong local_5a0 [2];
  byte abStack_590 [216];
  ios_base local_4b8 [268];
  undefined8 local_3ac;
  
  parseOptions(&local_678,argc,argv);
  if (local_678.nanomsg._M_string_length == 0) {
    if (local_678.files.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_678.files.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"No input specified",0x12);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'p');
      std::ostream::put('p');
      iVar5 = 1;
      local_6e8 = (FileReader *)0x0;
      std::ostream::flush();
      goto LAB_0012223a;
    }
    local_6e8 = (FileReader *)operator_new(0x228);
    FileReader::FileReader(local_6e8,&local_678.files);
  }
  else {
    local_6e8 = (FileReader *)operator_new(0x10);
    NanomsgReader::NanomsgReader((NanomsgReader *)local_6e8,&local_678.nanomsg);
  }
  util::mkdirp(&local_678.out);
  ::assembler::Assembler::Assembler((Assembler *)&local_5e0);
  local_698 = _VTT;
  local_6a0 = ___throw_bad_array_new_length;
LAB_00121d94:
  iVar5 = (*(local_6e8->super_PacketReader)._vptr_PacketReader[2])(local_6e8,&local_3ac);
  if ((char)iVar5 != '\0') {
    if (local_678.vcids._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)
    goto code_r0x00121db4;
    goto LAB_00121e08;
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_assembler::VirtualChannel>,_std::_Select1st<std::pair<const_int,_assembler::VirtualChannel>_>,_std::less<int>,_std::allocator<std::pair<const_int,_assembler::VirtualChannel>_>_>
  ::~_Rb_tree(&local_5e0);
  iVar5 = 0;
LAB_0012223a:
  if (local_6e8 != (FileReader *)0x0) {
    (*(local_6e8->super_PacketReader)._vptr_PacketReader[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678.out._M_dataplus._M_p != &local_678.out.field_2) {
    operator_delete(local_678.out._M_dataplus._M_p,local_678.out.field_2._M_allocated_capacity + 1);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_678.vcids._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_678.files);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678.nanomsg._M_dataplus._M_p != &local_678.nanomsg.field_2) {
    operator_delete(local_678.nanomsg._M_dataplus._M_p,
                    local_678.nanomsg.field_2._M_allocated_capacity + 1);
  }
  return iVar5;
code_r0x00121db4:
  uVar6 = local_3ac._1_1_ & 0x3f;
  p_Var7 = &local_678.vcids._M_t._M_impl.super__Rb_tree_header;
  p_Var12 = &p_Var7->_M_header;
  for (p_Var14 = local_678.vcids._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      (_Rb_tree_header *)p_Var14 != (_Rb_tree_header *)0x0;
      p_Var14 = (&p_Var14->_M_left)[(int)*(size_t *)(p_Var14 + 1) < (int)uVar6]) {
    if ((int)uVar6 <= (int)*(size_t *)(p_Var14 + 1)) {
      p_Var12 = p_Var14;
    }
  }
  p_Var13 = p_Var7;
  if (((_Rb_tree_header *)p_Var12 != p_Var7) &&
     (p_Var13 = (_Rb_tree_header *)p_Var12,
     (int)uVar6 < (int)((_Rb_tree_header *)p_Var12)->_M_node_count)) {
    p_Var13 = p_Var7;
  }
  if (p_Var13 != p_Var7) {
LAB_00121e08:
    local_5b0 = &local_3ac;
    ::assembler::Assembler::process(&local_690,(Assembler *)&local_5e0,(VCDU *)&local_5b0);
    puVar3 = local_690.
             super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (spdu = local_690.
                super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; spdu != puVar3; spdu = spdu + 1) {
      pSVar2 = (spdu->_M_t).
               super___uniq_ptr_impl<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
               ._M_t.
               super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
               .super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl;
      p_Var7 = &(pSVar2->m_)._M_t._M_impl.super__Rb_tree_header;
      p_Var14 = (pSVar2->m_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var12 = &p_Var7->_M_header;
      for (; p_Var14 != (_Base_ptr)0x0; p_Var14 = (&p_Var14->_M_left)[(int)p_Var14[1]._M_color < 4])
      {
        if (3 < (int)p_Var14[1]._M_color) {
          p_Var12 = p_Var14;
        }
      }
      p_Var14 = &p_Var7->_M_header;
      if (((_Rb_tree_header *)p_Var12 != p_Var7) &&
         (p_Var14 = p_Var12, 4 < (int)p_Var12[1]._M_color)) {
        p_Var14 = &p_Var7->_M_header;
      }
      if (((_Rb_tree_header *)p_Var14 != p_Var7) && (bVar4 = filter(&local_678,spdu), !bVar4)) {
        pcVar16 = "Writing: ";
        if (local_678.dryrun != false) {
          pcVar16 = "Writing (dry run): ";
        }
        lVar15 = 9;
        if (local_678.dryrun != false) {
          lVar15 = 0x13;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar16,lVar15);
        local_5b0 = local_5a0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_5b0,local_678.out._M_dataplus._M_p,
                   local_678.out._M_dataplus._M_p + local_678.out._M_string_length);
        std::__cxx11::string::append((char *)&local_5b0);
        filename_abi_cxx11_(&local_6c0,spdu);
        uVar17 = 0xf;
        if (local_5b0 != local_5a0) {
          uVar17 = local_5a0[0];
        }
        if (uVar17 < local_6c0._M_string_length + local_5a8) {
          uVar18 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
            uVar18 = local_6c0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar18 < local_6c0._M_string_length + local_5a8) goto LAB_00121f5f;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_6c0,0,(char *)0x0,(ulong)local_5b0);
        }
        else {
LAB_00121f5f:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_5b0,(ulong)local_6c0._M_dataplus._M_p);
        }
        plVar1 = puVar8 + 2;
        if ((long *)*puVar8 == plVar1) {
          local_6d0 = *plVar1;
          uStack_6c8 = puVar8[3];
          local_6e0 = &local_6d0;
        }
        else {
          local_6d0 = *plVar1;
          local_6e0 = (long *)*puVar8;
        }
        local_6d8 = puVar8[1];
        *puVar8 = plVar1;
        puVar8[1] = 0;
        *(undefined1 *)plVar1 = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
          operator_delete(local_6c0._M_dataplus._M_p,local_6c0.field_2._M_allocated_capacity + 1);
        }
        if (local_5b0 != local_5a0) {
          operator_delete(local_5b0,local_5a0[0] + 1);
        }
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_6e0,local_6d8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        if (local_678.dryrun == false) {
          std::ofstream::ofstream((string *)&local_5b0,(string *)&local_6e0,_S_bin);
          std::ostream::write((char *)&local_5b0,
                              *(long *)&(((spdu->_M_t).
                                          super___uniq_ptr_impl<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
                                          .super__Head_base<0UL,_assembler::SessionPDU_*,_false>.
                                         _M_head_impl)->buf_).
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl);
          std::ofstream::close();
          if ((abStack_590[local_5b0[-3]] & 5) == 0) {
            local_5b0 = local_698;
            *(undefined8 *)((long)&local_5b0 + local_698[-3]) = local_6a0;
            std::filebuf::~filebuf((filebuf *)&local_5a8);
            std::ios_base::~ios_base(local_4b8);
            goto LAB_001220fa;
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
          piVar10 = __errno_location();
          pcVar16 = strerror(*piVar10);
          if (pcVar16 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x15c358);
          }
          else {
            sVar11 = strlen(pcVar16);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar16,sVar11)
            ;
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
          std::ostream::put('X');
          std::ostream::flush();
          local_5b0 = local_698;
          *(undefined8 *)((long)&local_5b0 + local_698[-3]) = local_6a0;
          std::filebuf::~filebuf((filebuf *)&local_5a8);
          std::ios_base::~ios_base(local_4b8);
        }
        else {
LAB_001220fa:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," bytes)",7);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
        }
        if (local_6e0 != &local_6d0) {
          operator_delete(local_6e0,local_6d0 + 1);
        }
      }
    }
    std::
    vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
    ::~vector(&local_690);
  }
  goto LAB_00121d94;
}

Assistant:

int main(int argc, char** argv) {
  auto opts = parseOptions(argc, argv);

  // Create packet reader depending on options
  std::unique_ptr<PacketReader> reader;
  if (!opts.nanomsg.empty()) {
    reader = std::make_unique<NanomsgReader>(opts.nanomsg);
  } else if (!opts.files.empty()) {
    reader = std::make_unique<FileReader>(opts.files);
  } else {
    std::cerr << "No input specified" << std::endl;
    return 1;
  }

  // Make sure output directory exists
  mkdirp(opts.out);

  // Pass packets to packet assembler
  assembler::Assembler assembler;
  std::array<uint8_t, 892> buf;
  while (reader->nextPacket(buf)) {
    VCDU vcdu(buf);

    // Don't process VCDU if VCID was not specified
    if (!opts.vcids.empty() && opts.vcids.count(vcdu.getVCID()) == 0) {
      continue;
    }

    auto spdus = assembler.process(buf);
    for (auto& spdu : spdus) {

      // Skip stuff without filename
      if (!spdu->hasHeader<lrit::AnnotationHeader>()) {
        continue;
      }

      // Check if we should include this file
      if (filter(opts, spdu)) {
        continue;
      }

      if (opts.dryrun) {
        std::cout << "Writing (dry run): ";
      } else {
        std::cout << "Writing: ";
      }

      const auto name = opts.out + "/" + filename(spdu);
      std::cout << name << " ";

      if (!opts.dryrun) {
        std::ofstream fout(name, std::ofstream::binary);
        const auto& buf = spdu->get();
        fout.write((const char*)buf.data(), buf.size());
        fout.close();
        if (fout.fail()) {
          std::cout << "(" << strerror(errno) << ")" << std::endl;
          continue;
        }
      }

      std::cout << "(" << spdu->size() << " bytes)" << std::endl;
    }
  }
}